

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O0

SchnorrPubkeyDataStruct *
cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPubkey
          (SchnorrPubkeyDataStruct *__return_storage_ptr__,TweakPubkeyDataStruct *request)

{
  TweakPubkeyDataStruct *this;
  string *in_R8;
  allocator local_131;
  function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)>
  local_130;
  undefined1 local_110 [246];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  TweakPubkeyDataStruct *pTStack_18;
  anon_class_1_0_00000001 call_func;
  TweakPubkeyDataStruct *request_local;
  SchnorrPubkeyDataStruct *result;
  
  local_1a = 0;
  pTStack_18 = request;
  SchnorrPubkeyDataStruct::SchnorrPubkeyDataStruct(__return_storage_ptr__);
  this = pTStack_18;
  std::function<cfd::js::api::SchnorrPubkeyDataStruct(cfd::js::api::TweakPubkeyDataStruct_const&)>::
  function<cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPubkey(cfd::js::api::TweakPubkeyDataStruct_const&)::__0&,void>
            ((function<cfd::js::api::SchnorrPubkeyDataStruct(cfd::js::api::TweakPubkeyDataStruct_const&)>
              *)local_110,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"TweakAddSchnorrPubkeyFromPubkey",&local_131);
  ExecuteStructApi<cfd::js::api::TweakPubkeyDataStruct,cfd::js::api::SchnorrPubkeyDataStruct>
            ((SchnorrPubkeyDataStruct *)(local_110 + 0x20),(api *)this,
             (TweakPubkeyDataStruct *)local_110,&local_130,in_R8);
  SchnorrPubkeyDataStruct::operator=
            (__return_storage_ptr__,(SchnorrPubkeyDataStruct *)(local_110 + 0x20));
  SchnorrPubkeyDataStruct::~SchnorrPubkeyDataStruct((SchnorrPubkeyDataStruct *)(local_110 + 0x20));
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)>
  ::~function((function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)>
               *)local_110);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkeyDataStruct SchnorrApi::TweakAddSchnorrPubkeyFromPubkey(
    const TweakPubkeyDataStruct& request) {
  auto call_func =
      [](const TweakPubkeyDataStruct& request) -> SchnorrPubkeyDataStruct {
    SchnorrPubkeyDataStruct response;

    SchnorrPubkey pubkey(request.pubkey);
    ByteData256 tweak(request.tweak);
    bool parity = false;
    auto tweaked_pubkey = pubkey.CreateTweakAdd(tweak, &parity);
    response.pubkey = tweaked_pubkey.GetHex();
    response.parity = parity;
    return response;
  };

  SchnorrPubkeyDataStruct result;
  result = ExecuteStructApi<TweakPubkeyDataStruct, SchnorrPubkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}